

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::visitSIMDLoadStoreLane(FunctionValidator *this,SIMDLoadStoreLane *curr)

{
  bool bVar1;
  Index bytes;
  Memory *pMVar2;
  Type right;
  ulong uVar3;
  Type TVar4;
  char *text;
  
  pMVar2 = Module::getMemoryOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->memory).super_IString.str);
  shouldBeTrue<wasm::SIMDLoadStoreLane*>
            (this,pMVar2 != (Memory *)0x0,curr,"memory.SIMDLoadStoreLane memory must exist");
  shouldBeTrue<wasm::SIMDLoadStoreLane*>
            (this,SUB41(((((this->
                           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                           ).
                           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .
                           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currModule)->features).features & 8) >> 3,0),curr,
             "SIMD operations require SIMD [--enable-simd]");
  bVar1 = SIMDLoadStoreLane::isLoad(curr);
  if (bVar1) {
    text = "loadX_lane must have type v128";
    TVar4.id = 6;
  }
  else {
    text = "storeX_lane must have type none";
    TVar4.id = 0;
  }
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression.
                        type.id,TVar4,curr,text);
  TVar4.id = (curr->ptr->type).id;
  right = indexType(this,(Name)(curr->memory).super_IString.str);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
            (this,TVar4,right,curr,"loadX_lane or storeX_lane address must match memory index type")
  ;
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
            (this,(Type)(curr->vec->type).id,(Type)0x6,curr,
             "loadX_lane or storeX_lane vector argument must have type v128");
  uVar3 = (ulong)curr->op;
  if (uVar3 < 8) {
    TVar4.id = *(uintptr_t *)(&DAT_00bea2e8 + uVar3 * 8);
    uVar3 = *(ulong *)(&DAT_00bea328 + uVar3 * 8);
    bytes = SIMDLoadStoreLane::getMemBytes(curr);
    validateAlignment(this,(curr->align).addr,TVar4,bytes,false,(Expression *)curr);
    shouldBeTrue<wasm::SIMDLoadStoreLane*>(this,curr->index < uVar3,curr,"invalid lane index");
    return;
  }
  handle_unreachable("Unexpected SIMDLoadStoreLane op",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                     ,0x579);
}

Assistant:

void FunctionValidator::visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.SIMDLoadStoreLane memory must exist");
  shouldBeTrue(getModule()->features.hasSIMD(),
               curr,
               "SIMD operations require SIMD [--enable-simd]");
  if (curr->isLoad()) {
    shouldBeEqualOrFirstIsUnreachable(
      curr->type, Type(Type::v128), curr, "loadX_lane must have type v128");
  } else {
    shouldBeEqualOrFirstIsUnreachable(
      curr->type, Type(Type::none), curr, "storeX_lane must have type none");
  }
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    indexType(curr->memory),
    curr,
    "loadX_lane or storeX_lane address must match memory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->vec->type,
    Type(Type::v128),
    curr,
    "loadX_lane or storeX_lane vector argument must have type v128");
  size_t lanes;
  Type memAlignType = Type::none;
  switch (curr->op) {
    case Load8LaneVec128:
    case Store8LaneVec128:
      lanes = 16;
      memAlignType = Type::i32;
      break;
    case Load16LaneVec128:
    case Store16LaneVec128:
      lanes = 8;
      memAlignType = Type::i32;
      break;
    case Load32LaneVec128:
    case Store32LaneVec128:
      lanes = 4;
      memAlignType = Type::i32;
      break;
    case Load64LaneVec128:
    case Store64LaneVec128:
      lanes = 2;
      memAlignType = Type::i64;
      break;
    default:
      WASM_UNREACHABLE("Unexpected SIMDLoadStoreLane op");
  }
  Index bytes = curr->getMemBytes();
  validateAlignment(curr->align, memAlignType, bytes, /*isAtomic=*/false, curr);
  shouldBeTrue(curr->index < lanes, curr, "invalid lane index");
}